

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall Catch::TestCaseTracking::ITracker::~ITracker(ITracker *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__ITracker_00277c60;
  NameAndLocation::~NameAndLocation((NameAndLocation *)0x1306c0);
  return;
}

Assistant:

ITracker::~ITracker() = default;